

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O3

size_t __thiscall VMScriptFunction::PropagateMark(VMScriptFunction *this)

{
  byte bVar1;
  FVoidObj *pFVar2;
  FVoidObj in_RAX;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  FVoidObj local_38;
  
  pFVar2 = this->KonstA;
  bVar1 = this->NumKonstA;
  uVar6 = (ulong)bVar1;
  local_38 = in_RAX;
  if (bVar1 != 0 && pFVar2 != (FVoidObj *)0x0) {
    iVar4 = bVar1 + 1;
    lVar5 = 0;
    do {
      if (*(char *)((long)pFVar2 + lVar5 + uVar6 * 8) == '\x01') {
        local_38 = pFVar2[lVar5];
        GC::Mark(&local_38.o);
        pFVar2[lVar5] = local_38;
      }
      iVar4 = iVar4 + -1;
      lVar5 = lVar5 + 1;
    } while (1 < iVar4);
    uVar6 = (ulong)this->NumKonstA;
  }
  sVar3 = DObject::PropagateMark((DObject *)this);
  return sVar3 + uVar6 * 8;
}

Assistant:

size_t VMScriptFunction::PropagateMark()
{
	if (KonstA != NULL)
	{
		FVoidObj *konsta = KonstA;
		VM_UBYTE *atag = KonstATags();
		for (int count = NumKonstA; count > 0; --count)
		{
			if (*atag++ == ATAG_OBJECT)
			{
				GC::Mark(konsta->o);
			}
			konsta++;
		}
	}
	return NumKonstA * sizeof(void *) + Super::PropagateMark();
}